

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::FileExists(string *filename,bool isFile)

{
  int iVar1;
  bool bVar2;
  
  if (filename->_M_string_length == 0) {
    bVar2 = true;
  }
  else {
    iVar1 = access((filename->_M_dataplus)._M_p,4);
    bVar2 = iVar1 != 0;
  }
  if (isFile && bVar2 == false) {
    bVar2 = FileIsDirectory(filename);
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool SystemTools::FileExists(const std::string& filename, bool isFile)
{
  if(SystemTools::FileExists(filename))
    {
    // If isFile is set return not FileIsDirectory,
    // so this will only be true if it is a file
    return !isFile || !SystemTools::FileIsDirectory(filename);
    }
  return false;
}